

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void funnelsort<16u,buffer_layout_bfs>(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t sVar3;
  uchar *puVar4;
  char *__s;
  unsigned_long uVar5;
  int iVar6;
  ostream *poVar7;
  uchar **ppuVar8;
  size_t sVar9;
  uchar **ppuVar10;
  size_t num;
  byte bVar11;
  byte bVar12;
  long lVar13;
  unsigned_long uVar14;
  uchar *__s2;
  DI __d;
  array<unsigned_long,_16UL> buffer_count;
  array<Stream,_16UL> streams;
  array<unsigned_char_*,_336UL> buffers;
  fill<16U,_2U,_buffer_layout_bfs> local_c59;
  uchar **local_c58;
  DI local_c50;
  uchar **local_c48;
  size_t local_c40;
  array<unsigned_long,_16UL> local_c38;
  long lStack_bb8;
  array<Stream,_16UL> local_bb0;
  uchar *local_ab0 [8];
  undefined8 local_a70 [8];
  undefined1 auStack_a30 [2560];
  
  local_c58 = tmp;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"funnelsort",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(), n=",6);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  ppuVar8 = local_c58;
  if (n < 0x20) {
    ppuVar8 = strings;
    if (1 < n) {
      do {
        pbVar1 = ppuVar8[1];
        for (ppuVar10 = ppuVar8 + 1; strings < ppuVar10; ppuVar10 = ppuVar10 + -1) {
          pbVar2 = ppuVar10[-1];
          bVar11 = *pbVar2;
          bVar12 = *pbVar1;
          if (bVar11 != 0 && bVar11 == bVar12) {
            lVar13 = 1;
            do {
              bVar11 = pbVar2[lVar13];
              bVar12 = pbVar1[lVar13];
              if (bVar11 == 0) break;
              lVar13 = lVar13 + 1;
            } while (bVar11 == bVar12);
          }
          if (bVar11 <= bVar12) break;
          *ppuVar10 = pbVar2;
        }
        iVar6 = (int)n;
        *ppuVar10 = pbVar1;
        n = (size_t)(iVar6 - 1);
        ppuVar8 = ppuVar8 + 1;
      } while (2 < iVar6);
    }
  }
  else {
    local_bb0._M_elems[0].n = n >> 4;
    local_bb0._M_elems[0].stream = strings;
    ppuVar10 = strings + local_bb0._M_elems[0].n;
    lVar13 = 0x18;
    do {
      *(uchar ***)((long)&lStack_bb8 + lVar13) = ppuVar10;
      *(size_t *)((long)&local_bb0._M_elems[0].stream + lVar13) = local_bb0._M_elems[0].n;
      ppuVar10 = ppuVar10 + local_bb0._M_elems[0].n;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0xf8);
    local_bb0._M_elems[0xf].stream = local_bb0._M_elems[0xe].stream + local_bb0._M_elems[0].n;
    local_bb0._M_elems[0xf].n = local_bb0._M_elems[0].n * -0xf + n;
    lVar13 = 0;
    local_c48 = strings;
    local_c40 = n;
    do {
      ppuVar10 = *(uchar ***)((long)&local_bb0._M_elems[0].stream + lVar13);
      sVar3 = *(size_t *)((long)&local_bb0._M_elems[0].n + lVar13);
      funnelsort<8u,buffer_layout_bfs>(ppuVar10,sVar3,ppuVar8);
      check_input(ppuVar10,sVar3);
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x100);
    local_c38._M_elems[0xe] = 0;
    local_c38._M_elems[0xf] = 0;
    local_c38._M_elems[0xc] = 0;
    local_c38._M_elems[0xd] = 0;
    local_c38._M_elems[10] = 0;
    local_c38._M_elems[0xb] = 0;
    local_c38._M_elems[8] = 0;
    local_c38._M_elems[9] = 0;
    local_c38._M_elems[6] = 0;
    local_c38._M_elems[7] = 0;
    local_c38._M_elems[4] = 0;
    local_c38._M_elems[5] = 0;
    local_c38._M_elems[2] = 0;
    local_c38._M_elems[3] = 0;
    local_c38._M_elems[0] = 0;
    local_c38._M_elems[1] = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"fill_root",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", root\n",7);
    local_c50.i = &__debug_indent_str_abi_cxx11_;
    std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
    uVar14 = 0;
    while ((uVar14 != 0 ||
           (fill<16U,_2U,_buffer_layout_bfs>::operator()(&local_c59,&local_bb0,local_ab0,&local_c38)
           , uVar14 = local_c38._M_elems[2], local_c38._M_elems[2] != 0))) {
      if ((local_c38._M_elems[3] == 0) &&
         (fill<16U,_3U,_buffer_layout_bfs>::operator()
                    ((fill<16U,_3U,_buffer_layout_bfs> *)&local_c59,&local_bb0,local_ab0,&local_c38)
         , uVar14 = local_c38._M_elems[2], local_c38._M_elems[3] == 0)) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"right stream drained\n",0x15);
        if (local_c38._M_elems[2] == 0) {
          __assert_fail("buffer_count[2] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x247,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        if (local_c38._M_elems[3] != 0) {
          __assert_fail("buffer_count[3] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                        ,0x248,
                        "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                       );
        }
        do {
          uVar14 = local_c38._M_elems[2];
          memcpy(ppuVar8,local_a70 + -local_c38._M_elems[2],local_c38._M_elems[2] * 8);
          local_c38._M_elems[2] = 0;
          fill<16U,_2U,_buffer_layout_bfs>::operator()(&local_c59,&local_bb0,local_ab0,&local_c38);
          ppuVar8 = ppuVar8 + uVar14;
        } while (local_c38._M_elems[2] != 0);
        goto LAB_0011f43e;
      }
      uVar5 = local_c38._M_elems[3];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"L:\'",3);
      puVar4 = local_ab0[8 - uVar14];
      if (puVar4 == (uchar *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar9 = strlen((char *)puVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)puVar4,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\', R:\'",6);
      __s = (char *)local_a70[8 - uVar5];
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar9 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'\n",2);
      puVar4 = local_ab0[8 - uVar14];
      if (puVar4 == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
      }
      __s2 = (uchar *)local_a70[8 - uVar5];
      if (__s2 == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                      ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar6 = strcmp((char *)puVar4,(char *)__s2);
      if (iVar6 < 1) {
        local_c38._M_elems[2] = local_c38._M_elems[2] - 1;
        __s2 = puVar4;
      }
      else {
        local_c38._M_elems[3] = local_c38._M_elems[3] - 1;
      }
      *ppuVar8 = __s2;
      ppuVar8 = ppuVar8 + 1;
      uVar14 = local_c38._M_elems[2];
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"left stream drained\n",0x14);
    if (local_c38._M_elems[2] != 0) {
      __assert_fail("buffer_count[2] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x238,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    if (local_c38._M_elems[3] == 0) {
      __assert_fail("buffer_count[3] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x239,
                    "void fill_root(std::array<Stream, K> &__restrict, unsigned char **__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict) [K = 16U, BufferLayout = buffer_layout_bfs]"
                   );
    }
    do {
      uVar14 = local_c38._M_elems[3];
      if (local_c38._M_elems[3] * 8 != 0) {
        memcpy(ppuVar8,auStack_a30 + local_c38._M_elems[3] * -8,local_c38._M_elems[3] * 8);
      }
      local_c38._M_elems[3] = 0;
      fill<16U,_3U,_buffer_layout_bfs>::operator()
                ((fill<16U,_3U,_buffer_layout_bfs> *)&local_c59,&local_bb0,local_ab0,&local_c38);
      ppuVar8 = ppuVar8 + uVar14;
    } while (local_c38._M_elems[3] != 0);
LAB_0011f43e:
    anon_func::DI::~DI(&local_c50);
    sVar3 = local_c40;
    ppuVar8 = local_c48;
    memcpy(local_c48,local_c58,local_c40 * 8);
    check_input(ppuVar8,sVar3);
  }
  return;
}

Assistant:

static void
funnelsort(unsigned char** strings, size_t n, unsigned char** restrict tmp)
{
	debug() << __func__ << "(), n=" << n << "\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	size_t splitter = n/K;
	std::array<Stream, K> streams;
	streams[0].stream = strings;
	streams[0].n      = splitter;
	for (unsigned i=1; i < K-1; ++i) {
		streams[i].stream = streams[i-1].stream + splitter;
		streams[i].n = splitter;
	}
	streams[K-1].stream = streams[K-2].stream + splitter;
	streams[K-1].n      = n - (K-1)*splitter;
	for (unsigned i=0; i < K; ++i) {
		funnelsort<(K>16?K/4:K/2),BufferLayout>(streams[i].stream,
		                                        streams[i].n, tmp);
		check_input(streams[i].stream, streams[i].n);
	}
	std::array<unsigned char*, buffer_total_size<K>::value> buffers;
	std::array<size_t, K> buffer_count;
	buffer_count.fill(0);
	fill_root<K,BufferLayout>(streams,tmp,buffers.data(),buffer_count);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	check_input(strings, n);
}